

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodBuilder.cpp
# Opt level: O1

InstructionNode * __thiscall
Lodtalk::MethodAssembler::Assembler::pushLiteral(Assembler *this,Oop literal)

{
  InstructionNode *pIVar1;
  size_t sVar2;
  
  if (literal.field_0 == (anon_union_8_4_0eb573b0_for_Oop_0)&NilObject) {
    pIVar1 = (InstructionNode *)operator_new(0x30);
    pIVar1->position = 0;
    pIVar1->_vptr_InstructionNode = (_func_int **)&PTR__InstructionNode_00164f00;
    *(undefined4 *)&pIVar1[1]._vptr_InstructionNode = 0x4f;
  }
  else if (literal.field_0 == (anon_union_8_4_0eb573b0_for_Oop_0)&TrueObject) {
    pIVar1 = (InstructionNode *)operator_new(0x30);
    pIVar1->position = 0;
    pIVar1->_vptr_InstructionNode = (_func_int **)&PTR__InstructionNode_00164f00;
    *(undefined4 *)&pIVar1[1]._vptr_InstructionNode = 0x4d;
  }
  else if (literal.field_0 == (anon_union_8_4_0eb573b0_for_Oop_0)&FalseObject) {
    pIVar1 = (InstructionNode *)operator_new(0x30);
    pIVar1->position = 0;
    pIVar1->_vptr_InstructionNode = (_func_int **)&PTR__InstructionNode_00164f00;
    *(undefined4 *)&pIVar1[1]._vptr_InstructionNode = 0x4e;
  }
  else if (literal.field_0 == (anon_union_8_4_0eb573b0_for_Oop_0)&DAT_00000001) {
    pIVar1 = (InstructionNode *)operator_new(0x30);
    pIVar1->position = 0;
    pIVar1->_vptr_InstructionNode = (_func_int **)&PTR__InstructionNode_00164f00;
    *(undefined4 *)&pIVar1[1]._vptr_InstructionNode = 0x50;
  }
  else {
    if (literal.field_0 != (uint8_t *)0x3) {
      sVar2 = addLiteral(this,literal);
      pIVar1 = (InstructionNode *)operator_new(0x30);
      pIVar1->position = 0;
      pIVar1->_vptr_InstructionNode = (_func_int **)&PTR__InstructionNode_00164fb0;
      *(int *)&pIVar1[1]._vptr_InstructionNode = (int)sVar2;
      goto LAB_0013df38;
    }
    pIVar1 = (InstructionNode *)operator_new(0x30);
    pIVar1->position = 0;
    pIVar1->_vptr_InstructionNode = (_func_int **)&PTR__InstructionNode_00164f00;
    *(undefined4 *)&pIVar1[1]._vptr_InstructionNode = 0x51;
  }
  *(undefined1 *)((long)&pIVar1[1]._vptr_InstructionNode + 4) = 0;
LAB_0013df38:
  pIVar1 = addInstruction(this,pIVar1);
  return pIVar1;
}

Assistant:

InstructionNode *Assembler::pushLiteral(Oop literal)
{
    if(literal == nilOop())
        return pushNil();
    if(literal == trueOop())
        return pushTrue();
    if(literal == falseOop())
        return pushFalse();
    if(literal == Oop::encodeSmallInteger(1))
        return pushOne();
    if(literal == Oop::encodeSmallInteger(0))
        return pushZero();

	return pushLiteralIndex((int)addLiteral(literal));
}